

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExceptionTranslatorRegistry::registerTranslator
          (ExceptionTranslatorRegistry *this,IExceptionTranslator *translator)

{
  unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>
  local_20;
  IExceptionTranslator *local_18;
  IExceptionTranslator *translator_local;
  ExceptionTranslatorRegistry *this_local;
  
  local_18 = translator;
  translator_local = (IExceptionTranslator *)this;
  std::
  unique_ptr<Catch::IExceptionTranslator_const,std::default_delete<Catch::IExceptionTranslator_const>>
  ::unique_ptr<std::default_delete<Catch::IExceptionTranslator_const>,void>
            ((unique_ptr<Catch::IExceptionTranslator_const,std::default_delete<Catch::IExceptionTranslator_const>>
              *)&local_20,translator);
  clara::std::
  vector<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>,_std::allocator<std::unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>_>_>
  ::push_back(&this->m_translators,(value_type *)&local_20);
  clara::std::
  unique_ptr<const_Catch::IExceptionTranslator,_std::default_delete<const_Catch::IExceptionTranslator>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

void ExceptionTranslatorRegistry::registerTranslator( const IExceptionTranslator* translator ) {
        m_translators.push_back( std::unique_ptr<const IExceptionTranslator>( translator ) );
    }